

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

void sznet::net::sockets::sz_toipport(char *buf,size_t size,sockaddr *addr)

{
  uint16_t uVar1;
  size_t sVar2;
  sockaddr_in6 *psVar3;
  sockaddr_in *psVar4;
  uint16_t port;
  sockaddr_in *addr4;
  size_t end;
  uint16_t port_1;
  sockaddr_in6 *addr6;
  size_t end_1;
  sockaddr *addr_local;
  size_t size_local;
  char *buf_local;
  
  if (addr->sa_family == 10) {
    *buf = '[';
    sz_toip(buf + 1,size - 1,addr);
    sVar2 = strlen(buf);
    psVar3 = sz_sockaddrin6_cast(addr);
    uVar1 = networkToHost16(psVar3->sin6_port);
    if (size <= sVar2) {
      __assert_fail("size > end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xf0,
                    "void sznet::net::sockets::sz_toipport(char *, size_t, const struct sockaddr *)"
                   );
    }
    snprintf(buf + sVar2,size - sVar2,"]:%u",(ulong)uVar1);
  }
  else {
    sz_toip(buf,size,addr);
    sVar2 = strlen(buf);
    psVar4 = sz_sockaddrin_cast(addr);
    uVar1 = networkToHost16(psVar4->sin_port);
    if (size <= sVar2) {
      __assert_fail("size > end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
                    ,0xf8,
                    "void sznet::net::sockets::sz_toipport(char *, size_t, const struct sockaddr *)"
                   );
    }
    snprintf(buf + sVar2,size - sVar2,":%u",(ulong)uVar1);
  }
  return;
}

Assistant:

void sz_toipport(char* buf, size_t size, const struct sockaddr* addr)
{
	if (addr->sa_family == AF_INET6)
	{
		buf[0] = '[';
		sz_toip(buf + 1, size - 1, addr);
		size_t end = ::strlen(buf);
		const struct sockaddr_in6* addr6 = sz_sockaddrin6_cast(addr);
		uint16_t port = sockets::networkToHost16(addr6->sin6_port);
		assert(size > end);
		snprintf(buf + end, size - end, "]:%u", port);
		return;
	}
	sz_toip(buf, size, addr);
	size_t end = ::strlen(buf);
	const struct sockaddr_in* addr4 = sz_sockaddrin_cast(addr);
	uint16_t port = sockets::networkToHost16(addr4->sin_port);
	assert(size > end);
	snprintf(buf + end, size - end, ":%u", port);
}